

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O2

uint32_t __thiscall ExportEntryWrapper::getFuncNameId(ExportEntryWrapper *this)

{
  iterator iVar1;
  WORD ord;
  
  if (this->parentDir != (ExportDirWrapper *)0x0) {
    ord = (WORD)(this->super_ExeNodeWrapper).entryNum;
    iVar1 = std::
            _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_int>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
            ::find(&(this->parentDir->ordToNameId)._M_t,&ord);
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(this->parentDir->ordToNameId)._M_t._M_impl.super__Rb_tree_header) {
      return *(uint32_t *)&iVar1._M_node[1].field_0x4;
    }
  }
  return 0xffffffff;
}

Assistant:

uint32_t ExportEntryWrapper::getFuncNameId()
{
    if (this->parentDir == NULL) return INVALID_ID;

    WORD ord = static_cast<WORD>(this->entryNum);
    std::map<WORD, DWORD>::iterator found = parentDir->ordToNameId.find(ord);
    if (found == parentDir->ordToNameId.end()) {
        return INVALID_ID;
    }
    return found->second;
}